

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::TracingServiceImpl::ConsumerEndpointImpl::ObserveEvents
          (ConsumerEndpointImpl *this,uint32_t events_mask)

{
  bool bVar1;
  TracingSession *tracing_session;
  reference ppVar2;
  ProducerEndpointImpl *producer_00;
  ProducerEndpointImpl *producer;
  pair<const_unsigned_short,_perfetto::TracingServiceImpl::DataSourceInstance> *kv;
  iterator __end2;
  iterator __begin2;
  multimap<unsigned_short,_perfetto::TracingServiceImpl::DataSourceInstance,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_perfetto::TracingServiceImpl::DataSourceInstance>_>_>
  *__range2;
  TracingSession *session;
  uint32_t events_mask_local;
  ConsumerEndpointImpl *this_local;
  
  this->observable_events_mask_ = events_mask;
  tracing_session = GetTracingSession(this->service_,this->tracing_session_id_);
  if (tracing_session != (TracingSession *)0x0) {
    if ((this->observable_events_mask_ & 1) != 0) {
      __end2 = std::
               multimap<unsigned_short,_perfetto::TracingServiceImpl::DataSourceInstance,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_perfetto::TracingServiceImpl::DataSourceInstance>_>_>
               ::begin(&tracing_session->data_source_instances);
      kv = (pair<const_unsigned_short,_perfetto::TracingServiceImpl::DataSourceInstance> *)
           std::
           multimap<unsigned_short,_perfetto::TracingServiceImpl::DataSourceInstance,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_perfetto::TracingServiceImpl::DataSourceInstance>_>_>
           ::end(&tracing_session->data_source_instances);
      while (bVar1 = std::operator!=(&__end2,(_Self *)&kv), bVar1) {
        ppVar2 = std::
                 _Rb_tree_iterator<std::pair<const_unsigned_short,_perfetto::TracingServiceImpl::DataSourceInstance>_>
                 ::operator*(&__end2);
        producer_00 = GetProducer(this->service_,ppVar2->first);
        OnDataSourceInstanceStateChange(this,producer_00,&ppVar2->second);
        std::
        _Rb_tree_iterator<std::pair<const_unsigned_short,_perfetto::TracingServiceImpl::DataSourceInstance>_>
        ::operator++(&__end2);
      }
    }
    if ((this->observable_events_mask_ & 2) != 0) {
      MaybeNotifyAllDataSourcesStarted(this->service_,tracing_session);
    }
  }
  return;
}

Assistant:

void TracingServiceImpl::ConsumerEndpointImpl::ObserveEvents(
    uint32_t events_mask) {
  PERFETTO_DCHECK_THREAD(thread_checker_);
  observable_events_mask_ = events_mask;
  TracingSession* session = service_->GetTracingSession(tracing_session_id_);
  if (!session)
    return;

  if (observable_events_mask_ & ObservableEvents::TYPE_DATA_SOURCES_INSTANCES) {
    // Issue initial states.
    for (const auto& kv : session->data_source_instances) {
      ProducerEndpointImpl* producer = service_->GetProducer(kv.first);
      PERFETTO_DCHECK(producer);
      OnDataSourceInstanceStateChange(*producer, kv.second);
    }
  }

  // If the ObserveEvents() call happens after data sources have acked already
  // notify immediately.
  if (observable_events_mask_ &
      ObservableEvents::TYPE_ALL_DATA_SOURCES_STARTED) {
    service_->MaybeNotifyAllDataSourcesStarted(session);
  }
}